

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.h
# Opt level: O0

RemoveResponse * __thiscall Future<RemoveResponse>::get(Future<RemoveResponse> *this)

{
  bool bVar1;
  element_type *peVar2;
  long in_RSI;
  RemoveResponse *in_RDI;
  RemoveResponse *this_00;
  undefined1 local_40 [64];
  
  this_00 = in_RDI;
  if (((*(byte *)(in_RSI + 0x48) & 1) == 0) &&
     (bVar1 = std::operator!=((shared_ptr<AsyncTask<RemoveResponse>_> *)in_RDI,in_RDI), bVar1)) {
    peVar2 = std::
             __shared_ptr_access<AsyncTask<RemoveResponse>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<AsyncTask<RemoveResponse>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1599e0);
    (**peVar2->_vptr_AsyncTask)(local_40);
    RemoveResponse::operator=(this_00,in_RDI);
    RemoveResponse::~RemoveResponse(this_00);
    *(undefined1 *)(in_RSI + 0x48) = 1;
  }
  RemoveResponse::RemoveResponse(this_00,in_RDI);
  return this_00;
}

Assistant:

virtual T get() {
    if (!is_done_ && task_ != nullptr) {
      result_ = task_->get();
      is_done_ = true;
    }
    return result_;
  }